

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  univalue_constructor();
  univalue_push_throw();
  univalue_typecheck();
  univalue_set();
  univalue_array();
  univalue_object();
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    univalue_readwrite();
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int main(int argc, char* argv[])
{
    univalue_constructor();
    univalue_push_throw();
    univalue_typecheck();
    univalue_set();
    univalue_array();
    univalue_object();
    univalue_readwrite();
    return 0;
}